

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O1

FIOBJ fiobj_hash_replace(FIOBJ hash,FIOBJ key,FIOBJ obj)

{
  uint64_t hash_value;
  FIOBJ old;
  FIOBJ local_28;
  
  if (((uint)hash & 7) == 4) {
    local_28 = 0;
    hash_value = fiobj_obj2hash(key);
    fio_hash___insert((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),hash_value,key,obj,&local_28
                     );
    fiobj_free(obj);
    return local_28;
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,0xf0,"FIOBJ fiobj_hash_replace(FIOBJ, FIOBJ, FIOBJ)");
}

Assistant:

FIOBJ fiobj_hash_replace(FIOBJ hash, FIOBJ key, FIOBJ obj) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old = FIOBJ_INVALID;
  fio_hash___insert(&obj2hash(hash)->hash, fiobj_obj2hash(key), key, obj, &old);
  fiobj_free(obj); /* take ownership - free the user's reference. */
  return old;
}